

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_copy_imheader(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  char cVar1;
  int iVar2;
  int nrec;
  int nkeys;
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  ffghsp(infptr,&nkeys,(int *)0x0,status);
  nrec = 5;
  do {
    if (nkeys < nrec) {
      return *status;
    }
    ffgrec(infptr,nrec,card,status);
    iVar2 = ffgkcl(card);
    cVar1 = card[0];
    if (iVar2 != 100 && 0x14 < iVar2) {
      if ((card[0] == 'D') && (iVar2 = bcmp(card,"DATE ",5), iVar2 == 0)) {
        ffpdat(outfptr,status);
      }
      else if ((cVar1 == 'E') && (CONCAT71(card._1_7_,card[0]) == 0x20454d414e545845)) {
        iVar2 = bcmp(card,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c);
        if (iVar2 != 0) {
          ffucrd(outfptr,"EXTNAME",card,status);
        }
      }
      else {
        ffprec(outfptr,card,status);
      }
      if (0 < *status) {
        return *status;
      }
    }
    nrec = nrec + 1;
  } while( true );
}

Assistant:

int imcomp_copy_imheader(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine reads the header keywords from the input image and
    copies them to the output image;  the manditory structural keywords
    and the checksum keywords are not copied. If the DATE keyword is copied,
    then it is updated with the current date and time.
*/
{
    int nkeys, ii, keyclass;
    char card[FLEN_CARD];	/* a header record */

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, NULL, status); /* get number of keywords in image */

    for (ii = 5; ii <= nkeys; ii++)  /* skip the first 4 keywords */
    {
        ffgrec(infptr, ii, card, status);

	keyclass = ffgkcl(card);  /* Get the type/class of keyword */

        /* don't copy structural keywords or checksum keywords */
        if ((keyclass <= TYP_CMPRS_KEY) || (keyclass == TYP_CKSUM_KEY))
	    continue;

        if (FSTRNCMP(card, "DATE ", 5) == 0) /* write current date */
        {
            ffpdat(outfptr, status);
        }
        else if (FSTRNCMP(card, "EXTNAME ", 8) == 0) 
        {
            /* don't copy default EXTNAME keyword from a compressed image */
            if (FSTRNCMP(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28))
            {
                /* if EXTNAME keyword already exists, overwrite it */
                /* otherwise append a new EXTNAME keyword */
                ffucrd(outfptr, "EXTNAME", card, status);
            }
        }
        else
        {
            /* just copy the keyword to the output header */
	    ffprec (outfptr, card, status);
        }

        if (*status > 0)
           return (*status);
    }
    return (*status);
}